

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lys_compile_augment_children
                 (lysc_ctx *ctx,lysp_when *aug_when,uint16_t aug_flags,lysp_node *child,
                 lysc_node *target,ly_bool child_unres_disabled)

{
  ushort uVar1;
  lysc_node *node;
  ly_ctx *ctx_00;
  bool bVar2;
  ushort uVar3;
  LY_ERR LVar4;
  lysc_node *ctx_node;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ly_bool enabled;
  uint local_60;
  uint local_5c;
  ly_set child_set;
  lysc_when *when_shared;
  
  when_shared = (lysc_when *)0x0;
  child_set.size = 0;
  child_set.count = 0;
  child_set.field_2.dnodes = (lyd_node **)0x0;
  if (((aug_when != (lysp_when *)0x0) || (target->nodetype == 2)) ||
     (bVar2 = true, ctx->cur_mod == target->module)) {
    bVar2 = false;
  }
  local_60 = ctx->compile_opts;
  local_5c = (uint)aug_flags;
  do {
    uVar7 = local_60;
    if (child == (lysp_node *)0x0) {
      LVar4 = LY_SUCCESS;
LAB_0014fd5f:
      ly_set_erase(&child_set,(_func_void_void_ptr *)0x0);
      ctx->compile_opts = uVar7;
      return LVar4;
    }
    uVar1 = child->nodetype;
    if (uVar1 == 0x80) {
      uVar3 = target->nodetype;
      if (uVar3 != 2) {
LAB_0014fd91:
        ctx_00 = ctx->ctx;
        pcVar5 = lys_nodetype2str(uVar3);
        pcVar6 = lys_nodetype2str(child->nodetype);
        ly_vlog(ctx_00,(char *)0x0,LYVE_REFERENCE,
                "Invalid augment of %s node which is not allowed to contain %s node \"%s\".",pcVar5,
                pcVar6,child->name);
        LVar4 = LY_EVALID;
        goto LAB_0014fd5f;
      }
LAB_0014fbf1:
      LVar4 = lys_compile_node_choice_child(ctx,child,target,&child_set);
    }
    else {
      if (((uVar1 & 0x700) != 0) && (uVar3 = target->nodetype, (uVar3 & 0x11) == 0))
      goto LAB_0014fd91;
      uVar3 = target->nodetype;
      if (uVar1 == 0x800) {
        if (uVar3 == 2) {
          uVar3 = 2;
          goto LAB_0014fd91;
        }
      }
      else if (uVar3 == 2) goto LAB_0014fbf1;
      if ((uVar3 & 0x3000) != 0) {
        ctx->compile_opts = (uint)(uVar3 != 0x1000) * 0x1000 + 0x1004 | local_60;
      }
      LVar4 = lys_compile_node(ctx,child,target,(uint16_t)local_5c,&child_set);
    }
    if ((LVar4 != LY_SUCCESS) ||
       (LVar4 = lys_eval_iffeatures(ctx->ctx,child->iffeatures,&enabled), LVar4 != LY_SUCCESS))
    goto LAB_0014fd5f;
    if ((enabled == '\0') && ((ctx->compile_opts & 0xb) == 0)) {
      ctx->compile_opts = ctx->compile_opts | 2;
    }
    for (uVar8 = 0; uVar8 < (ulong)child_set._0_8_ >> 0x20; uVar8 = uVar8 + 1) {
      node = (lysc_node *)child_set.field_2.dnodes[uVar8];
      if ((bVar2) && ((~node->flags & 0x21) == 0)) {
        node->flags = node->flags & 0xffdf;
        lys_compile_mandatory_parents(target,'\0');
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                "Invalid augment adding mandatory node \"%s\" without making it conditional via when statement."
                ,node->name);
        LVar4 = LY_EVALID;
        uVar7 = local_60;
        goto LAB_0014fd5f;
      }
      if (aug_when != (lysp_when *)0x0) {
        ctx_node = lysc_data_node(target);
        LVar4 = lys_compile_when(ctx,aug_when,(uint16_t)local_5c,target,ctx_node,node,&when_shared);
        uVar7 = local_60;
        if (LVar4 != LY_SUCCESS) goto LAB_0014fd5f;
      }
      if (child_unres_disabled != '\0') {
        ly_set_add(&ctx->unres->disabled,node,'\x01',(uint32_t *)0x0);
      }
    }
    ly_set_erase(&child_set,(_func_void_void_ptr *)0x0);
    ctx->compile_opts = local_60;
    child = child->next;
  } while( true );
}

Assistant:

static LY_ERR
lys_compile_augment_children(struct lysc_ctx *ctx, struct lysp_when *aug_when, uint16_t aug_flags, struct lysp_node *child,
        struct lysc_node *target, ly_bool child_unres_disabled)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysp_node *pnode;
    struct lysc_node *node;
    struct lysc_when *when_shared = NULL;
    ly_bool enabled, allow_mand = 0;
    struct ly_set child_set = {0};
    uint32_t i, opt_prev = ctx->compile_opts;

    /* check for mandatory nodes
     * - new cases augmenting some choice can have mandatory nodes
     * - mandatory nodes are allowed only in case the augmentation is made conditional with a when statement
     */
    if (aug_when || (target->nodetype == LYS_CHOICE) || (ctx->cur_mod == target->module)) {
        allow_mand = 1;
    }

    LY_LIST_FOR(child, pnode) {
        /* check if the subnode can be connected to the found target (e.g. case cannot be inserted into container) */
        if (((pnode->nodetype == LYS_CASE) && (target->nodetype != LYS_CHOICE)) ||
                ((pnode->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)) && !(target->nodetype & (LYS_CONTAINER | LYS_LIST))) ||
                ((pnode->nodetype == LYS_USES) && (target->nodetype == LYS_CHOICE))) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid augment of %s node which is not allowed to contain %s node \"%s\".",
                    lys_nodetype2str(target->nodetype), lys_nodetype2str(pnode->nodetype), pnode->name);
            rc = LY_EVALID;
            goto cleanup;
        }

        /* compile the children */
        if (target->nodetype == LYS_CHOICE) {
            LY_CHECK_GOTO(rc = lys_compile_node_choice_child(ctx, pnode, target, &child_set), cleanup);
        } else if (target->nodetype & (LYS_INPUT | LYS_OUTPUT)) {
            if (target->nodetype == LYS_INPUT) {
                ctx->compile_opts |= LYS_COMPILE_RPC_INPUT;
            } else {
                ctx->compile_opts |= LYS_COMPILE_RPC_OUTPUT;
            }
            LY_CHECK_GOTO(rc = lys_compile_node(ctx, pnode, target, aug_flags, &child_set), cleanup);
        } else {
            LY_CHECK_GOTO(rc = lys_compile_node(ctx, pnode, target, aug_flags, &child_set), cleanup);
        }

        /* eval if-features again for the rest of this node processing */
        LY_CHECK_GOTO(rc = lys_eval_iffeatures(ctx->ctx, pnode->iffeatures, &enabled), cleanup);
        if (!enabled && !(ctx->compile_opts & (LYS_COMPILE_NO_DISABLED | LYS_COMPILE_DISABLED | LYS_COMPILE_GROUPING))) {
            ctx->compile_opts |= LYS_COMPILE_DISABLED;
        }

        /* since the augment node is not present in the compiled tree, we need to pass some of its
         * statements to all its children */
        for (i = 0; i < child_set.count; ++i) {
            node = child_set.snodes[i];
            if (!allow_mand && (node->flags & LYS_CONFIG_W) && (node->flags & LYS_MAND_TRUE)) {
                node->flags &= ~LYS_MAND_TRUE;
                lys_compile_mandatory_parents(target, 0);
                LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                        "Invalid augment adding mandatory node \"%s\" without making it conditional via when statement.",
                        node->name);
                rc = LY_EVALID;
                goto cleanup;
            }

            if (aug_when) {
                /* pass augment's when to all the children */
                rc = lys_compile_when(ctx, aug_when, aug_flags, target, lysc_data_node(target), node, &when_shared);
                LY_CHECK_GOTO(rc, cleanup);
            }

            if (child_unres_disabled) {
                /* child is disabled by the augment if-features */
                ly_set_add(&ctx->unres->disabled, node, 1, NULL);
            }
        }

        /* next iter */
        ly_set_erase(&child_set, NULL);
        ctx->compile_opts = opt_prev;
    }

cleanup:
    ly_set_erase(&child_set, NULL);
    ctx->compile_opts = opt_prev;
    return rc;
}